

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitFunctionStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,FunctionStmt *stmt)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *this_00;
  undefined4 extraout_var;
  pointer pTVar4;
  undefined4 extraout_var_00;
  type expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  reference local_1f8;
  Param *param;
  iterator __end1;
  iterator __begin1;
  vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> *__range1;
  string separator;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  FunctionStmt *local_20;
  FunctionStmt *stmt_local;
  AstSerialise *this_local;
  
  local_20 = stmt;
  stmt_local = (FunctionStmt *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar3 = std::operator<<(local_198,"(Stmt::Function ");
  poVar3 = std::operator<<(poVar3,(string *)&(local_20->name).lexeme);
  std::operator<<(poVar3," (");
  std::__cxx11::string::string((string *)&__range1);
  this_00 = &local_20->params;
  __end1 = std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::
           begin(this_00);
  param = (Param *)std::
                   vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::
                   end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<enact::FunctionStmt::Param_*,_std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>_>
                                *)&param);
    if (!bVar1) break;
    local_1f8 = __gnu_cxx::
                __normal_iterator<enact::FunctionStmt::Param_*,_std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>_>
                ::operator*(&__end1);
    poVar3 = std::operator<<(local_198,(string *)&__range1);
    poVar3 = std::operator<<(poVar3,(string *)&(local_1f8->name).lexeme);
    poVar3 = std::operator<<(poVar3,' ');
    pTVar4 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
             operator->(&local_1f8->typename_);
    iVar2 = (*pTVar4->_vptr_Typename[4])();
    std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::operator=((string *)&__range1," ");
    __gnu_cxx::
    __normal_iterator<enact::FunctionStmt::Param_*,_std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>_>
    ::operator++(&__end1);
  }
  poVar3 = std::operator<<(local_198,") ");
  pTVar4 = std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::
           operator->(&local_20->returnTypename);
  iVar2 = (*pTVar4->_vptr_Typename[4])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
  std::operator<<(poVar3," (\n");
  std::__cxx11::string::operator+=((string *)&this->m_ident,"    ");
  expr = std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::operator*
                   (&local_20->body);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_218,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,&expr->super_Expr);
  std::operator<<(local_198,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  std::operator<<(local_198,')');
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitFunctionStmt(FunctionStmt &stmt) {
        std::stringstream s;

        s << "(Stmt::Function " << stmt.name.lexeme << " (";

        std::string separator;
        for (auto &param : stmt.params) {
            s << separator << param.name.lexeme << ' ' << param.typename_->name();
            separator = " ";
        }

        s << ") " << stmt.returnTypename->name() << " (\n";
        m_ident += "    ";

        s << visitExpr(*stmt.body);

        m_ident.erase(0, 4);
        s << ')';

        return s.str();
    }